

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::RandCaseStatement::fromSyntax
          (Compilation *compilation,RandCaseStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  pointer ppRVar1;
  size_t sVar2;
  long lVar3;
  undefined8 compilation_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RandCaseStatement *stmt;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *src;
  RandCaseStatement *args;
  long lVar8;
  SmallVector<slang::ast::RandCaseStatement::Item,_8UL> items;
  undefined1 local_100 [40];
  SourceRange local_d8;
  SmallVectorBase<slang::ast::RandCaseStatement::Item> local_c8 [3];
  
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 8;
  ppRVar1 = (syntax->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (syntax->items).super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  lVar8 = 0;
  bVar5 = false;
  src = context;
  local_100._16_8_ = syntax;
  local_100._24_8_ = compilation;
  local_100._32_8_ = stmtCtx;
  do {
    compilation_00 = local_100._24_8_;
    if (sVar2 << 3 == lVar8) {
      iVar6 = SmallVectorBase<slang::ast::RandCaseStatement::Item>::copy
                        (local_c8,(EVP_PKEY_CTX *)local_100._24_8_,(EVP_PKEY_CTX *)src);
      local_100._0_8_ = CONCAT44(extraout_var_01,iVar6);
      local_d8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_100._16_8_);
      args = (RandCaseStatement *)local_100;
      stmt = BumpAllocator::
             emplace<slang::ast::RandCaseStatement,std::span<slang::ast::RandCaseStatement::Item,18446744073709551615ul>,slang::SourceRange>
                       ((BumpAllocator *)compilation_00,
                        (span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *)args,
                        &local_d8);
      if (bVar5) {
        args = stmt;
        stmt = (RandCaseStatement *)
               Statement::badStmt((Compilation *)compilation_00,&stmt->super_Statement);
      }
      SmallVectorBase<slang::ast::RandCaseStatement::Item>::cleanup(local_c8,(EVP_PKEY_CTX *)args);
      return &stmt->super_Statement;
    }
    lVar3 = *(long *)((long)ppRVar1 + lVar8);
    iVar6 = Expression::bind((int)*(undefined8 *)(lVar3 + 0x18),(sockaddr *)context,0);
    iVar7 = Statement::bind((int)*(undefined8 *)(lVar3 + 0x30),(sockaddr *)context,
                            (socklen_t)local_100._32_8_);
    local_100._0_8_ = (Expression *)CONCAT44(extraout_var,iVar6);
    local_100._8_8_ = (Statement *)CONCAT44(extraout_var_00,iVar7);
    SmallVectorBase<slang::ast::RandCaseStatement::Item>::
    emplace_back<slang::ast::RandCaseStatement::Item>(local_c8,(Item *)local_100);
    src = extraout_RDX;
    if (((Statement *)CONCAT44(extraout_var_00,iVar7))->kind == Invalid) {
LAB_003d7e38:
      bVar5 = true;
    }
    else {
      bVar4 = ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var,iVar6));
      src = extraout_RDX_00;
      if (!bVar4) goto LAB_003d7e38;
    }
    lVar8 = lVar8 + 8;
  } while( true );
}

Assistant:

Statement& RandCaseStatement::fromSyntax(Compilation& compilation,
                                         const RandCaseStatementSyntax& syntax,
                                         const ASTContext& context, StatementContext& stmtCtx) {
    bool bad = false;
    SmallVector<Item, 8> items;
    for (auto item : syntax.items) {
        auto& expr = Expression::bind(*item->expr, context);
        auto& stmt = Statement::bind(*item->statement, context, stmtCtx);
        items.push_back({&expr, &stmt});

        if (stmt.bad() || !context.requireIntegral(expr)) {
            bad = true;
        }
    }

    auto result = compilation.emplace<RandCaseStatement>(items.copy(compilation),
                                                         syntax.sourceRange());
    if (bad)
        return badStmt(compilation, result);

    return *result;
}